

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O1

char * __thiscall jsoncons::not_an_object::what(not_an_object *this)

{
  string *psVar1;
  
  psVar1 = &this->what_;
  if ((this->what_)._M_string_length == 0) {
    std::runtime_error::what();
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::append((char *)psVar1);
    std::__cxx11::string::_M_append((char *)psVar1,(ulong)(this->name_)._M_dataplus._M_p);
    std::__cxx11::string::append((char *)psVar1);
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }